

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getContextPropertiesString
          (CLIntercept *this,cl_context_properties *properties,string *str)

{
  string *in_RDX;
  uint *in_RSI;
  CLIntercept *in_RDI;
  size_t value_2;
  size_t *psz;
  cl_bool value_1;
  cl_bool *pb;
  void *value;
  void **pp_1;
  string platformInfo;
  cl_platform_id platform;
  cl_platform_id *pp;
  cl_int property;
  char s [256];
  string *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  string local_1e0 [20];
  cl_int in_stack_fffffffffffffe34;
  CEnumNameMap *in_stack_fffffffffffffe38;
  long in_stack_fffffffffffffe50;
  CEnumNameMap *in_stack_fffffffffffffe58;
  string local_1a0 [32];
  long local_180;
  uint *local_178;
  string local_160 [32];
  string local_140 [36];
  uint local_11c;
  char local_118 [40];
  string *in_stack_ffffffffffffff10;
  cl_platform_id in_stack_ffffffffffffff18;
  CLIntercept *in_stack_ffffffffffffff20;
  uint *local_10;
  
  std::__cxx11::string::operator=(in_RDX,"");
  local_10 = in_RSI;
  if (in_RSI == (uint *)0x0) {
    std::__cxx11::string::operator=(in_RDX,"NULL");
  }
  else {
    while (*(long *)local_10 != 0) {
      local_11c = *local_10;
      enumName(in_RDI);
      CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
      std::__cxx11::string::operator+=(in_RDX,local_140);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      in_stack_fffffffffffffdfc = local_11c;
      if (local_11c == 0x1084) {
        local_178 = local_10 + 2;
        local_180 = *(long *)local_178;
        in_stack_fffffffffffffdf0 = local_1a0;
        std::__cxx11::string::string(in_stack_fffffffffffffdf0);
        getPlatformInfoString
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        std::__cxx11::string::operator+=(in_RDX,local_1a0);
        std::__cxx11::string::~string(local_1a0);
      }
      else if (local_11c == 0x1085) {
LAB_001f0a50:
        enumName(in_RDI);
        CEnumNameMap::name_bool_abi_cxx11_
                  (in_stack_fffffffffffffe58,(cl_bool)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        std::__cxx11::string::operator+=(in_RDX,local_1e0);
        std::__cxx11::string::~string(local_1e0);
      }
      else if (local_11c - 0x2008 < 5) {
LAB_001f09f8:
        in_stack_fffffffffffffe58 = (CEnumNameMap *)(local_10 + 2);
        in_stack_fffffffffffffe50 = *(long *)&(in_stack_fffffffffffffe58->m_cl_int)._M_t._M_impl;
        snprintf(local_118,0x100,"%p",in_stack_fffffffffffffe50);
        std::__cxx11::string::operator+=(in_RDX,local_118);
      }
      else {
        if (local_11c != 0x2030) {
          if (local_11c == 0x2032) goto LAB_001f0a50;
          if (local_11c == 0x40b0) goto LAB_001f09f8;
          if (local_11c == 0x40b1) {
            snprintf(local_118,0x100,"%zu",*(long *)(local_10 + 2));
            std::__cxx11::string::operator+=(in_RDX,local_118);
            goto LAB_001f0b5e;
          }
        }
        snprintf(local_118,0x100,"<Unknown %08X!>",(ulong)local_11c);
        std::__cxx11::string::operator+=(in_RDX,local_118);
      }
LAB_001f0b5e:
      local_10 = local_10 + 4;
      if (*(long *)local_10 != 0) {
        std::__cxx11::string::operator+=(in_RDX,", ");
      }
    }
  }
  return;
}

Assistant:

void CLIntercept::getContextPropertiesString(
    const cl_context_properties* properties,
    std::string& str ) const
{
    str = "";

    if( properties )
    {
        char    s[256];

        while( properties[0] != 0 )
        {
            cl_int  property = (cl_int)properties[0];
            str += enumName().name( property ) + " = ";

            switch( property )
            {
            case CL_CONTEXT_PLATFORM:
                {
                    const cl_platform_id* pp = (const cl_platform_id*)( properties + 1 );
                    const cl_platform_id  platform = pp[0];
                    std::string platformInfo;
                    getPlatformInfoString( platform, platformInfo );
                    str += platformInfo;
                }
                break;
            case CL_GL_CONTEXT_KHR:
            case CL_EGL_DISPLAY_KHR:
            case CL_GLX_DISPLAY_KHR:
            case CL_WGL_HDC_KHR:
            case CL_CGL_SHAREGROUP_KHR:
#if defined(_WIN32)
            case CL_CONTEXT_D3D10_DEVICE_KHR:
            case CL_CONTEXT_D3D11_DEVICE_KHR:
            case CL_CONTEXT_ADAPTER_D3D9_KHR:
            case CL_CONTEXT_ADAPTER_D3D9EX_KHR:
            case CL_CONTEXT_ADAPTER_DXVA_KHR:
#endif
            case CL_PRINTF_CALLBACK_ARM:
                {
                    const void** pp = (const void**)( properties + 1 );
                    const void*  value = pp[0];
                    CLI_SPRINTF( s, 256, "%p", value );
                    str += s;
                }
                break;
            case CL_CONTEXT_INTEROP_USER_SYNC:
            case CL_CONTEXT_TERMINATE_KHR:
                {
                    const cl_bool*  pb = (const cl_bool*)( properties + 1);
                    cl_bool value = pb[0];
                    str += enumName().name_bool( value );
                }
                break;
            case CL_PRINTF_BUFFERSIZE_ARM:
                {
                    const size_t*   psz = (const size_t*)( properties + 1);
                    size_t value = psz[0];
                    CLI_SPRINTF( s, 256, "%zu", value );
                    str += s;
                }
                break;
            case CL_CONTEXT_MEMORY_INITIALIZE_KHR:
                // TODO: this is a cl_context_memory_initialize_khr bitfield.
                // Fall through for now.
            default:
                {
                    CLI_SPRINTF( s, 256, "<Unknown %08X!>", (cl_uint)property );
                    str += s;
                }
                break;
            }

            properties += 2;
            if( properties[0] != 0 )
            {
                str += ", ";
            }
        }
    }
    else
    {
        str = "NULL";
    }
}